

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-otpc.cpp
# Opt level: O0

void __thiscall server::server(server *this,io_service *io_service,int port)

{
  io_context *context;
  int iVar1;
  type this_00;
  undefined4 extraout_var;
  int __type;
  int __domain;
  bind_t<void,_boost::_mfi::mf1<void,_server,_const_boost::system::error_code_&>,_boost::_bi::list2<boost::_bi::value<server_*>,_boost::arg<1>_(*)()>_>
  local_68;
  tcp local_3c;
  basic_endpoint<boost::asio::ip::tcp> local_38;
  int local_1c;
  io_service *piStack_18;
  int port_local;
  io_service *io_service_local;
  server *this_local;
  io_service *io_service_00;
  
  this->io_service_ = io_service;
  context = this->io_service_;
  local_1c = port;
  piStack_18 = io_service;
  io_service_local = (io_service *)this;
  local_3c = boost::asio::ip::tcp::v4();
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
            (&local_38,&local_3c,(unsigned_short)local_1c);
  iVar1 = 1;
  boost::asio::
  basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_socket_acceptor<boost::asio::io_context>
            (&this->acceptor_,context,&local_38,true,(type *)0x0);
  io_service_00 = this->io_service_;
  connection::create((connection *)&this->new_connection_,io_service_00);
  __domain = (int)io_service_00;
  this_00 = boost::shared_ptr<connection>::operator->(&this->new_connection_);
  iVar1 = connection::socket(this_00,__domain,__type,iVar1);
  boost::bind<void,server,boost::system::error_code_const&,server*,boost::arg<1>(*)()>
            (&local_68,(boost *)handle_accept,0,this,boost::asio::placeholders::error);
  boost::asio::
  basic_socket_acceptor<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::
  async_accept<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::_bi::bind_t<void,boost::_mfi::mf1<void,server,boost::system::error_code_const&>,boost::_bi::list2<boost::_bi::value<server*>,boost::arg<1>(*)()>>>
            ((basic_socket_acceptor<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)&this->acceptor_,
             (basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)CONCAT44(extraout_var,iVar1),&local_68,(type *)0x0);
  return;
}

Assistant:

server::server(ba::io_service& io_service,int port)
	: io_service_(io_service),
	  acceptor_(io_service_, ba::ip::tcp::endpoint(ba::ip::tcp::v4(), port)),
	  new_connection_(connection::create(io_service_)) {
	// start acceptor in async mode
	acceptor_.async_accept(new_connection_->socket(),
						   boost::bind(&server::handle_accept, this,
									   ba::placeholders::error));
}